

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.h
# Opt level: O0

intptr_t fiobj_obj2num(FIOBJ o)

{
  ulong uVar1;
  fiobj_object_vtable_s *pfVar2;
  uintptr_t sign;
  FIOBJ o_local;
  
  if ((o & 1) == 0) {
    if ((((o == 0) || (o == 0)) || ((o & 1) != 0)) || ((o & 6) == 6)) {
      o_local = (FIOBJ)(int)(uint)(o == 0x16);
    }
    else {
      pfVar2 = fiobj_type_vtable(o);
      o_local = (*pfVar2->to_i)(o);
    }
  }
  else {
    uVar1 = 0;
    if ((o & 0x8000000000000000) != 0) {
      uVar1 = 0xc000000000000000;
    }
    o_local = (o & 0x7fffffffffffffff) >> 1 | uVar1;
  }
  return o_local;
}

Assistant:

FIO_INLINE intptr_t fiobj_obj2num(const FIOBJ o) {
  if (o & FIOBJECT_NUMBER_FLAG) {
    const uintptr_t sign =
        (o & FIOBJ_NUMBER_SIGN_BIT)
            ? (FIOBJ_NUMBER_SIGN_BIT | FIOBJ_NUMBER_SIGN_EXCLUDE_BIT)
            : 0;
    return (intptr_t)(((o & FIOBJ_NUMBER_SIGN_MASK) >> 1) | sign);
  }
  if (!o || !FIOBJ_IS_ALLOCATED(o))
    return o == FIOBJ_T_TRUE;
  return FIOBJECT2VTBL(o)->to_i(o);
}